

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# leave.hpp
# Opt level: O0

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::getLeaveVals2(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *this,number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *leaveMax,SPxId enterId,
               number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *enterBound,
               number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *newUBbound,
               number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *newLBbound,
               number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *newCoPrhs,
               StableSum<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *objChange)

{
  bool bVar1;
  type_conflict5 tVar2;
  Status SVar3;
  ostream *poVar4;
  undefined8 uVar5;
  Status *pSVar6;
  ulong *puVar7;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar8;
  ostream *poVar9;
  SPxInternalCodeException *this_00;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_RCX;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_RSI;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_00000008;
  StableSum<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_00000010;
  Status enterStat_1;
  int idx_1;
  Status enterStat;
  int idx;
  Desc *ds;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_13;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_13;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_12;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_12;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_11;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_11;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_10;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_10;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_9;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_9;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_5;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_5;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_1;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_1;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_7;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_7;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_6;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_6;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_4;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_4;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_3;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_3;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_2;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_2;
  undefined4 in_stack_ffffffffffffe988;
  int in_stack_ffffffffffffe98c;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffe990;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffe998;
  allocator *paVar10;
  cpp_dec_float<100U,_int,_void> *in_stack_ffffffffffffe9a0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_ffffffffffffea18;
  ostream *in_stack_ffffffffffffea20;
  allocator local_1551;
  string local_1550 [4];
  int in_stack_ffffffffffffeab4;
  SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffeab8;
  allocator local_1529;
  string local_1528 [32];
  undefined4 local_1508;
  undefined4 local_1504;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1500;
  undefined1 local_14b0 [80];
  undefined1 local_1460 [80];
  undefined1 local_1410 [80];
  undefined1 local_13c0 [80];
  ulong local_1370;
  undefined1 local_1364 [80];
  undefined4 local_1314;
  undefined1 local_1310 [80];
  ulong local_12c0;
  undefined1 local_12b8 [80];
  undefined4 local_1268;
  undefined4 local_1264;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1260;
  undefined1 local_1210 [80];
  ulong local_11c0;
  undefined1 local_11b4 [80];
  undefined1 local_1164 [80];
  undefined4 local_1114;
  undefined1 local_1110 [80];
  ulong local_10c0;
  undefined1 local_10b8 [80];
  undefined4 local_1068;
  Status local_1064;
  SPxColId local_1060;
  int local_1058;
  undefined1 local_1052;
  allocator local_1051;
  string local_1050 [38];
  undefined1 local_102a;
  allocator local_1029;
  string local_1028 [35];
  undefined1 local_1005;
  allocator local_ff1;
  string local_ff0 [32];
  undefined1 local_fd0 [80];
  undefined1 local_f80 [80];
  undefined1 local_f30 [80];
  undefined1 local_ee0 [80];
  undefined1 local_e90 [80];
  undefined1 local_e40 [80];
  undefined1 local_df0 [80];
  undefined1 local_da0 [80];
  undefined1 local_d50 [80];
  ulong local_d00;
  undefined1 local_cf4 [80];
  undefined4 local_ca4;
  undefined1 local_ca0 [80];
  ulong local_c50;
  undefined1 local_c44 [80];
  undefined4 local_bf4;
  undefined4 local_bf0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_bec;
  undefined1 local_b9c [80];
  undefined4 local_b4c;
  undefined1 local_b48 [80];
  ulong local_af8;
  undefined1 local_aec [80];
  undefined4 local_a9c;
  ulong local_a98;
  undefined1 local_a90 [80];
  undefined1 local_a40 [80];
  undefined4 local_9f0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_9ec;
  undefined1 local_99c [80];
  Status local_94c;
  SPxRowId local_948;
  int local_940 [2];
  Desc *local_938;
  undefined8 local_930;
  undefined8 local_928;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_920;
  SPxId local_908;
  undefined8 local_900;
  undefined8 local_8f8;
  undefined1 *local_8f0;
  undefined8 local_8e8;
  ulong *local_8e0;
  undefined1 *local_8d8;
  undefined8 local_8d0;
  ulong *local_8c8;
  undefined1 *local_8c0;
  undefined8 local_8b8;
  undefined8 local_8b0;
  undefined1 *local_8a8;
  undefined8 local_8a0;
  ulong *local_898;
  undefined1 *local_890;
  undefined8 local_888;
  undefined8 local_880;
  undefined1 *local_878;
  undefined8 local_870;
  ulong *local_868;
  undefined1 *local_860;
  undefined8 local_858;
  undefined8 local_850;
  undefined1 *local_848;
  undefined8 local_840;
  ulong *local_838;
  undefined1 *local_830;
  undefined8 local_828;
  undefined8 local_820;
  undefined1 *local_818;
  undefined8 local_810;
  undefined8 local_808;
  undefined1 *local_800;
  undefined8 local_7f8;
  ulong *local_7f0;
  undefined1 *local_7e8;
  undefined8 local_7e0;
  ulong *local_7d8;
  undefined1 *local_7d0;
  undefined8 local_7c8;
  undefined8 local_7c0;
  undefined1 *local_7b8;
  undefined8 local_7b0;
  ulong *local_7a8;
  undefined1 *local_7a0;
  undefined8 local_798;
  undefined8 local_790;
  undefined1 *local_788;
  undefined4 *local_780;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_778;
  undefined4 *local_770;
  undefined8 local_768;
  undefined4 *local_760;
  undefined8 local_758;
  undefined4 *local_750;
  undefined8 local_748;
  undefined4 *local_740;
  undefined8 local_738;
  undefined4 *local_730;
  undefined8 local_728;
  undefined4 *local_720;
  undefined8 local_718;
  undefined4 *local_710;
  undefined8 local_708;
  undefined4 *local_700;
  undefined8 local_6f8;
  int *local_6f0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_6e8;
  undefined1 *local_6e0;
  undefined8 local_6d8;
  undefined1 *local_6d0;
  undefined8 local_6c8;
  undefined1 *local_6c0;
  undefined8 local_6b8;
  undefined1 *local_6b0;
  undefined8 local_6a8;
  undefined1 *local_6a0;
  undefined8 local_698;
  undefined1 *local_690;
  undefined8 local_688;
  undefined1 *local_680;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_678;
  undefined1 *local_670;
  undefined8 local_668;
  undefined1 *local_660;
  undefined8 local_658;
  undefined1 *local_650;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_648;
  undefined1 *local_640;
  undefined8 local_638;
  undefined1 *local_630;
  undefined8 local_628;
  undefined1 *local_620;
  undefined8 local_618;
  undefined1 *local_610;
  undefined8 local_608;
  undefined1 *local_600;
  undefined8 local_5f8;
  undefined1 *local_5f0;
  undefined8 local_5e8;
  undefined1 *local_5e0;
  undefined8 local_5d8;
  undefined1 *local_5d0;
  undefined8 local_5c8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_5c0;
  undefined8 local_5b8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_5b0;
  undefined8 local_5a8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_5a0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_590;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_580;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_578;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_570;
  undefined8 local_568;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_560;
  undefined8 local_558;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_550;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_540;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_538;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_530;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_528;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_520;
  undefined8 local_518;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_510;
  undefined8 local_508;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_500;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_4f0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_4e8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_4e0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_4d0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_4c0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_4b0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_4a0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_490;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_480;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_478;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_470;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_460;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_458;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_450;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_440;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_430;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_420;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_410;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_400;
  int *local_3f0;
  undefined4 *local_3e8;
  undefined4 *local_3e0;
  undefined4 *local_3d8;
  undefined4 *local_3d0;
  undefined4 *local_3c8;
  undefined4 *local_3c0;
  undefined4 *local_3b8;
  undefined4 *local_3b0;
  undefined4 *local_3a8;
  undefined8 local_3a0;
  ulong *local_398;
  undefined8 local_390;
  ulong *local_388;
  ulong *local_380;
  undefined8 local_378;
  undefined8 local_370;
  ulong *local_368;
  undefined8 local_360;
  ulong *local_358;
  undefined8 local_350;
  ulong *local_348;
  undefined8 local_340;
  ulong *local_338;
  ulong *local_330;
  undefined8 local_328;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_319;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_318;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_310;
  undefined1 *local_308;
  undefined1 *local_300;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2f8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2f0;
  undefined1 *local_2e8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_2d9;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2d8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2d0;
  undefined1 *local_2c8;
  undefined1 *local_2c0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2b8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2b0;
  undefined1 *local_2a8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_299;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_298;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_290;
  undefined1 *local_288;
  undefined1 *local_280;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_278;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_270;
  undefined1 *local_268;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_259;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_258;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_250;
  undefined1 *local_248;
  undefined1 *local_240;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_238;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_230;
  undefined1 *local_228;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_219;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_218;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_210;
  undefined1 *local_208;
  undefined1 *local_200;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1f8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1f0;
  undefined1 *local_1e8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_1d9;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1d8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1d0;
  undefined1 *local_1c8;
  undefined1 *local_1c0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1b8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1b0;
  undefined1 *local_1a8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_199;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_198;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_190;
  undefined1 *local_188;
  undefined1 *local_180;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_178;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_170;
  undefined1 *local_168;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_159;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_158;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_150;
  undefined1 *local_148;
  undefined1 *local_140;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_138;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_130;
  undefined1 *local_128;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_119;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_118;
  undefined1 *local_110;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_108;
  undefined1 *local_100;
  undefined1 *local_f8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_e9;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_e8;
  undefined1 *local_e0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_d8;
  undefined1 *local_d0;
  undefined1 *local_c8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_b9;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_b8;
  undefined1 *local_b0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_a8;
  undefined1 *local_a0;
  undefined1 *local_98;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_89;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_88;
  undefined1 *local_80;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_59;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_58;
  undefined1 *local_50;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_29;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_28;
  undefined1 *local_20;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_18;
  undefined1 *local_10;
  undefined1 *local_8;
  
  local_930 = in_R9;
  local_928 = in_R8;
  local_920 = in_RCX;
  local_938 = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::desc(&in_RDI->
                      super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    );
  local_940[1] = 0;
  local_6e8 = local_920;
  local_6f0 = local_940 + 1;
  local_3f0 = local_6f0;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
            ((cpp_dec_float<100U,_int,_void> *)in_stack_ffffffffffffe990,
             CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988));
  bVar1 = SPxId::isSPxRowId(&local_908);
  if (bVar1) {
    SPxRowId::SPxRowId(&local_948,&local_908);
    local_940[0] = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ::number(in_stack_ffffffffffffe990,
                            (SPxRowId *)
                            CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988));
    pSVar6 = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ::Desc::rowStatus((Desc *)in_stack_ffffffffffffe990,in_stack_ffffffffffffe98c);
    local_94c = *pSVar6;
    switch(local_94c) {
    case D_FREE:
      UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::delta(in_RDI->thePvec);
      SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::operator[](in_stack_ffffffffffffe998,(int)((ulong)in_stack_ffffffffffffe990 >> 0x20));
      local_148 = local_99c;
      local_150 = &local_9ec;
      local_158 = in_RSI;
      boost::multiprecision::detail::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
      ::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                (&local_159,local_150,in_RSI);
      local_140 = local_99c;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<100U,_int,_void> *)in_stack_ffffffffffffe990);
      local_128 = local_99c;
      local_130 = local_150;
      local_138 = local_158;
      boost::multiprecision::default_ops::
      eval_multiply<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                ((cpp_dec_float<100U,_int,_void> *)in_stack_ffffffffffffe990,
                 (cpp_dec_float<100U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988),
                 (cpp_dec_float<100U,_int,_void> *)0x4db399);
      local_9f0 = 0;
      tVar2 = boost::multiprecision::operator<
                        ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)in_stack_ffffffffffffe998,(int *)in_stack_ffffffffffffe990);
      if (tVar2) {
        local_400 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  *)in_stack_ffffffffffffe990,in_stack_ffffffffffffe98c);
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                  ((cpp_dec_float<100U,_int,_void> *)in_stack_ffffffffffffe990,
                   (cpp_dec_float<100U,_int,_void> *)
                   CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988));
      }
      else {
        local_410 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  *)in_stack_ffffffffffffe990,in_stack_ffffffffffffe98c);
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                  ((cpp_dec_float<100U,_int,_void> *)in_stack_ffffffffffffe990,
                   (cpp_dec_float<100U,_int,_void> *)
                   CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988));
      }
      local_8f8 = infinity();
      local_8f0 = local_a40;
      local_900 = 0;
      local_328 = local_8f8;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
                (in_stack_ffffffffffffe9a0,(double)in_stack_ffffffffffffe998,
                 in_stack_ffffffffffffe990);
      local_5c8 = local_928;
      local_5d0 = local_a40;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                ((cpp_dec_float<100U,_int,_void> *)in_stack_ffffffffffffe990,
                 (cpp_dec_float<100U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988));
      puVar7 = (ulong *)infinity();
      local_a98 = *puVar7 ^ 0x8000000000000000;
      local_8d8 = local_a90;
      local_8e0 = &local_a98;
      local_8e8 = 0;
      local_330 = local_8e0;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
                (in_stack_ffffffffffffe9a0,(double)in_stack_ffffffffffffe998,
                 in_stack_ffffffffffffe990);
      local_5d8 = local_930;
      local_5e0 = local_a90;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                ((cpp_dec_float<100U,_int,_void> *)in_stack_ffffffffffffe990,
                 (cpp_dec_float<100U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988));
      pSVar6 = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ::Desc::rowStatus((Desc *)in_stack_ffffffffffffe990,in_stack_ffffffffffffe98c);
      *pSVar6 = P_FIXED;
      break;
    case D_ON_UPPER:
      local_a9c = 0;
      local_6f8 = local_928;
      local_700 = &local_a9c;
      local_3e8 = local_700;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                ((cpp_dec_float<100U,_int,_void> *)in_stack_ffffffffffffe990,
                 CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988));
      puVar7 = (ulong *)infinity();
      local_af8 = *puVar7 ^ 0x8000000000000000;
      local_8c0 = local_aec;
      local_8c8 = &local_af8;
      local_8d0 = 0;
      local_338 = local_8c8;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
                (in_stack_ffffffffffffe9a0,(double)in_stack_ffffffffffffe998,
                 in_stack_ffffffffffffe990);
      local_5e8 = local_930;
      local_5f0 = local_aec;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                ((cpp_dec_float<100U,_int,_void> *)in_stack_ffffffffffffe990,
                 (cpp_dec_float<100U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988));
      pSVar6 = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ::Desc::rowStatus((Desc *)in_stack_ffffffffffffe990,in_stack_ffffffffffffe98c);
      *pSVar6 = P_ON_LOWER;
      local_420 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                *)in_stack_ffffffffffffe990,in_stack_ffffffffffffe98c);
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                ((cpp_dec_float<100U,_int,_void> *)in_stack_ffffffffffffe990,
                 (cpp_dec_float<100U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988));
      break;
    case D_ON_LOWER:
      local_8b0 = infinity();
      local_8a8 = local_b48;
      local_8b8 = 0;
      local_340 = local_8b0;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
                (in_stack_ffffffffffffe9a0,(double)in_stack_ffffffffffffe998,
                 in_stack_ffffffffffffe990);
      local_5f8 = local_928;
      local_600 = local_b48;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                ((cpp_dec_float<100U,_int,_void> *)in_stack_ffffffffffffe990,
                 (cpp_dec_float<100U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988));
      local_b4c = 0;
      local_708 = local_930;
      local_710 = &local_b4c;
      local_3e0 = local_710;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                ((cpp_dec_float<100U,_int,_void> *)in_stack_ffffffffffffe990,
                 CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988));
      pSVar6 = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ::Desc::rowStatus((Desc *)in_stack_ffffffffffffe990,in_stack_ffffffffffffe98c);
      *pSVar6 = P_ON_UPPER;
      local_430 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                *)in_stack_ffffffffffffe990,in_stack_ffffffffffffe98c);
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                ((cpp_dec_float<100U,_int,_void> *)in_stack_ffffffffffffe990,
                 (cpp_dec_float<100U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988));
      break;
    case D_ON_BOTH:
      UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::delta(in_RDI->thePvec);
      SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::operator[](in_stack_ffffffffffffe998,(int)((ulong)in_stack_ffffffffffffe990 >> 0x20));
      local_188 = local_b9c;
      local_198 = &local_bec;
      local_190 = in_RSI;
      boost::multiprecision::detail::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
      ::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                (&local_199,in_RSI,local_198);
      local_180 = local_b9c;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<100U,_int,_void> *)in_stack_ffffffffffffe990);
      local_168 = local_b9c;
      local_170 = local_190;
      local_178 = local_198;
      boost::multiprecision::default_ops::
      eval_multiply<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                ((cpp_dec_float<100U,_int,_void> *)in_stack_ffffffffffffe990,
                 (cpp_dec_float<100U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988),
                 (cpp_dec_float<100U,_int,_void> *)0x4db94a);
      local_bf0 = 0;
      tVar2 = boost::multiprecision::operator<
                        ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)in_stack_ffffffffffffe998,(int *)in_stack_ffffffffffffe990);
      if (tVar2) {
        local_bf4 = 0;
        local_718 = local_928;
        local_720 = &local_bf4;
        local_3d8 = local_720;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                  ((cpp_dec_float<100U,_int,_void> *)in_stack_ffffffffffffe990,
                   CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988));
        puVar7 = (ulong *)infinity();
        local_c50 = *puVar7 ^ 0x8000000000000000;
        local_890 = local_c44;
        local_898 = &local_c50;
        local_8a0 = 0;
        local_348 = local_898;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
                  (in_stack_ffffffffffffe9a0,(double)in_stack_ffffffffffffe998,
                   in_stack_ffffffffffffe990);
        local_608 = local_930;
        local_610 = local_c44;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                  ((cpp_dec_float<100U,_int,_void> *)in_stack_ffffffffffffe990,
                   (cpp_dec_float<100U,_int,_void> *)
                   CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988));
        pSVar6 = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ::Desc::rowStatus((Desc *)in_stack_ffffffffffffe990,in_stack_ffffffffffffe98c);
        *pSVar6 = P_ON_LOWER;
        local_440 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  *)in_stack_ffffffffffffe990,in_stack_ffffffffffffe98c);
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                  ((cpp_dec_float<100U,_int,_void> *)in_stack_ffffffffffffe990,
                   (cpp_dec_float<100U,_int,_void> *)
                   CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988));
      }
      else {
        local_880 = infinity();
        local_878 = local_ca0;
        local_888 = 0;
        local_350 = local_880;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
                  (in_stack_ffffffffffffe9a0,(double)in_stack_ffffffffffffe998,
                   in_stack_ffffffffffffe990);
        local_618 = local_928;
        local_620 = local_ca0;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                  ((cpp_dec_float<100U,_int,_void> *)in_stack_ffffffffffffe990,
                   (cpp_dec_float<100U,_int,_void> *)
                   CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988));
        local_ca4 = 0;
        local_728 = local_930;
        local_730 = &local_ca4;
        local_3d0 = local_730;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                  ((cpp_dec_float<100U,_int,_void> *)in_stack_ffffffffffffe990,
                   CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988));
        pSVar6 = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ::Desc::rowStatus((Desc *)in_stack_ffffffffffffe990,in_stack_ffffffffffffe98c);
        *pSVar6 = P_ON_UPPER;
        local_450 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  *)in_stack_ffffffffffffe990,in_stack_ffffffffffffe98c);
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                  ((cpp_dec_float<100U,_int,_void> *)in_stack_ffffffffffffe990,
                   (cpp_dec_float<100U,_int,_void> *)
                   CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988));
      }
      break;
    case P_FIXED:
      poVar9 = std::operator<<((ostream *)&std::cerr,"ELEAVE54 ");
      poVar9 = std::operator<<(poVar9,"ERROR! Tried to put a fixed row variable into the basis: ");
      poVar9 = std::operator<<(poVar9,"idx=");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,local_940[0]);
      poVar9 = std::operator<<(poVar9,", lhs=");
      SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::lhs(in_stack_ffffffffffffe990,in_stack_ffffffffffffe98c);
      poVar4 = boost::multiprecision::operator<<
                         (in_stack_ffffffffffffea20,
                          (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)poVar9);
      poVar4 = std::operator<<(poVar4,", rhs=");
      SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::rhs(in_stack_ffffffffffffe990,in_stack_ffffffffffffe98c);
      poVar9 = boost::multiprecision::operator<<
                         (poVar4,(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)poVar9);
      std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
      local_102a = 1;
      uVar5 = __cxa_allocate_exception(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1028,"XLEAVE05 This should never happen.",&local_1029);
      SPxInternalCodeException::SPxInternalCodeException
                ((SPxInternalCodeException *)in_stack_ffffffffffffe990,
                 (string *)CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988));
      local_102a = 0;
      __cxa_throw(uVar5,&SPxInternalCodeException::typeinfo,
                  SPxInternalCodeException::~SPxInternalCodeException);
    default:
      local_1052 = 1;
      uVar5 = __cxa_allocate_exception(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1050,"XLEAVE06 This should never happen.",&local_1051);
      SPxInternalCodeException::SPxInternalCodeException
                ((SPxInternalCodeException *)in_stack_ffffffffffffe990,
                 (string *)CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988));
      local_1052 = 0;
      __cxa_throw(uVar5,&SPxInternalCodeException::typeinfo,
                  SPxInternalCodeException::~SPxInternalCodeException);
    case P_ON_LOWER:
      SVar3 = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::dualRowStatus(in_stack_ffffffffffffeab8,in_stack_ffffffffffffeab4);
      pSVar6 = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ::Desc::rowStatus((Desc *)in_stack_ffffffffffffe990,in_stack_ffffffffffffe98c);
      *pSVar6 = SVar3;
      SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::rhs(in_stack_ffffffffffffe990,in_stack_ffffffffffffe98c);
      local_850 = infinity();
      local_848 = local_e90;
      local_858 = 0;
      local_360 = local_850;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
                (in_stack_ffffffffffffe9a0,(double)in_stack_ffffffffffffe998,
                 in_stack_ffffffffffffe990);
      tVar2 = boost::multiprecision::operator<
                        ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988),
                         (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)0x4dc1e2);
      if (tVar2) {
        pnVar8 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               *)in_stack_ffffffffffffe990,in_stack_ffffffffffffe98c);
        local_478 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  *)in_stack_ffffffffffffe990,in_stack_ffffffffffffe98c);
        local_480 = pnVar8;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                  ((cpp_dec_float<100U,_int,_void> *)in_stack_ffffffffffffe990,
                   (cpp_dec_float<100U,_int,_void> *)
                   CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988));
      }
      local_490 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                *)in_stack_ffffffffffffe990,in_stack_ffffffffffffe98c);
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                ((cpp_dec_float<100U,_int,_void> *)in_stack_ffffffffffffe990,
                 (cpp_dec_float<100U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988));
      local_b8 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ::rhs(in_stack_ffffffffffffe990,in_stack_ffffffffffffe98c);
      local_b0 = local_ee0;
      boost::multiprecision::detail::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
      ::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                (&local_b9,local_b8);
      local_a0 = local_ee0;
      local_a8 = local_b8;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<100U,_int,_void> *)in_stack_ffffffffffffe990,
                 (cpp_dec_float<100U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988));
      local_98 = local_ee0;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::negate
                ((cpp_dec_float<100U,_int,_void> *)in_stack_ffffffffffffe990);
      local_658 = local_930;
      local_660 = local_ee0;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                ((cpp_dec_float<100U,_int,_void> *)in_stack_ffffffffffffe990,
                 (cpp_dec_float<100U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988));
      local_e8 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ::lhs(in_stack_ffffffffffffe990,in_stack_ffffffffffffe98c);
      local_e0 = local_f30;
      boost::multiprecision::detail::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
      ::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                (&local_e9,local_e8);
      local_d0 = local_f30;
      local_d8 = local_e8;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<100U,_int,_void> *)in_stack_ffffffffffffe990,
                 (cpp_dec_float<100U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988));
      local_c8 = local_f30;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::negate
                ((cpp_dec_float<100U,_int,_void> *)in_stack_ffffffffffffe990);
      local_668 = local_928;
      local_670 = local_f30;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                ((cpp_dec_float<100U,_int,_void> *)in_stack_ffffffffffffe990,
                 (cpp_dec_float<100U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988));
      local_118 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::lhs(in_stack_ffffffffffffe990,in_stack_ffffffffffffe98c);
      local_110 = local_f80;
      boost::multiprecision::detail::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
      ::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                (&local_119,local_118);
      local_100 = local_f80;
      local_108 = local_118;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<100U,_int,_void> *)in_stack_ffffffffffffe990,
                 (cpp_dec_float<100U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988));
      local_f8 = local_f80;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::negate
                ((cpp_dec_float<100U,_int,_void> *)in_stack_ffffffffffffe990);
      local_678 = local_920;
      local_680 = local_f80;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                ((cpp_dec_float<100U,_int,_void> *)in_stack_ffffffffffffe990,
                 (cpp_dec_float<100U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988));
      local_218 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::lhs(in_stack_ffffffffffffe990,in_stack_ffffffffffffe98c);
      local_208 = local_fd0;
      local_210 = in_stack_00000008;
      boost::multiprecision::detail::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
      ::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                (&local_219,in_stack_00000008,local_218);
      local_200 = local_fd0;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<100U,_int,_void> *)in_stack_ffffffffffffe990);
      local_1e8 = local_fd0;
      local_1f0 = local_210;
      local_1f8 = local_218;
      boost::multiprecision::default_ops::
      eval_multiply<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                ((cpp_dec_float<100U,_int,_void> *)in_stack_ffffffffffffe990,
                 (cpp_dec_float<100U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988),
                 (cpp_dec_float<100U,_int,_void> *)0x4dc5c9);
      StableSum<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::operator-=((StableSum<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *)in_stack_ffffffffffffe990,
                   (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988));
      break;
    case P_ON_UPPER:
      SVar3 = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::dualRowStatus(in_stack_ffffffffffffeab8,in_stack_ffffffffffffeab4);
      pSVar6 = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ::Desc::rowStatus((Desc *)in_stack_ffffffffffffe990,in_stack_ffffffffffffe98c);
      *pSVar6 = SVar3;
      SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::lhs(in_stack_ffffffffffffe990,in_stack_ffffffffffffe98c);
      puVar7 = (ulong *)infinity();
      local_d00 = *puVar7 ^ 0x8000000000000000;
      local_860 = local_cf4;
      local_868 = &local_d00;
      local_870 = 0;
      local_358 = local_868;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
                (in_stack_ffffffffffffe9a0,(double)in_stack_ffffffffffffe998,
                 in_stack_ffffffffffffe990);
      tVar2 = boost::multiprecision::operator>
                        ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988),
                         (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)0x4dbd1b);
      if (tVar2) {
        pnVar8 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               *)in_stack_ffffffffffffe990,in_stack_ffffffffffffe98c);
        local_458 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  *)in_stack_ffffffffffffe990,in_stack_ffffffffffffe98c);
        local_460 = pnVar8;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                  ((cpp_dec_float<100U,_int,_void> *)in_stack_ffffffffffffe990,
                   (cpp_dec_float<100U,_int,_void> *)
                   CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988));
      }
      local_470 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                *)in_stack_ffffffffffffe990,in_stack_ffffffffffffe98c);
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                ((cpp_dec_float<100U,_int,_void> *)in_stack_ffffffffffffe990,
                 (cpp_dec_float<100U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988));
      local_28 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ::lhs(in_stack_ffffffffffffe990,in_stack_ffffffffffffe98c);
      local_20 = local_d50;
      boost::multiprecision::detail::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
      ::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                (&local_29,local_28);
      local_10 = local_d50;
      local_18 = local_28;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<100U,_int,_void> *)in_stack_ffffffffffffe990,
                 (cpp_dec_float<100U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988));
      local_8 = local_d50;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::negate
                ((cpp_dec_float<100U,_int,_void> *)in_stack_ffffffffffffe990);
      local_628 = local_928;
      local_630 = local_d50;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                ((cpp_dec_float<100U,_int,_void> *)in_stack_ffffffffffffe990,
                 (cpp_dec_float<100U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988));
      local_58 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ::rhs(in_stack_ffffffffffffe990,in_stack_ffffffffffffe98c);
      local_50 = local_da0;
      boost::multiprecision::detail::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
      ::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                (&local_59,local_58);
      local_40 = local_da0;
      local_48 = local_58;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<100U,_int,_void> *)in_stack_ffffffffffffe990,
                 (cpp_dec_float<100U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988));
      local_38 = local_da0;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::negate
                ((cpp_dec_float<100U,_int,_void> *)in_stack_ffffffffffffe990);
      local_638 = local_930;
      local_640 = local_da0;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                ((cpp_dec_float<100U,_int,_void> *)in_stack_ffffffffffffe990,
                 (cpp_dec_float<100U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988));
      local_88 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ::rhs(in_stack_ffffffffffffe990,in_stack_ffffffffffffe98c);
      local_80 = local_df0;
      boost::multiprecision::detail::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
      ::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                (&local_89,local_88);
      local_70 = local_df0;
      local_78 = local_88;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<100U,_int,_void> *)in_stack_ffffffffffffe990,
                 (cpp_dec_float<100U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988));
      local_68 = local_df0;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::negate
                ((cpp_dec_float<100U,_int,_void> *)in_stack_ffffffffffffe990);
      local_648 = local_920;
      local_650 = local_df0;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                ((cpp_dec_float<100U,_int,_void> *)in_stack_ffffffffffffe990,
                 (cpp_dec_float<100U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988));
      local_1d8 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::rhs(in_stack_ffffffffffffe990,in_stack_ffffffffffffe98c);
      local_1c8 = local_e40;
      local_1d0 = in_stack_00000008;
      boost::multiprecision::detail::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
      ::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                (&local_1d9,in_stack_00000008,local_1d8);
      local_1c0 = local_e40;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<100U,_int,_void> *)in_stack_ffffffffffffe990);
      local_1a8 = local_e40;
      local_1b0 = local_1d0;
      local_1b8 = local_1d8;
      boost::multiprecision::default_ops::
      eval_multiply<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                ((cpp_dec_float<100U,_int,_void> *)in_stack_ffffffffffffe990,
                 (cpp_dec_float<100U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988),
                 (cpp_dec_float<100U,_int,_void> *)0x4dc102);
      StableSum<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::operator-=((StableSum<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *)in_stack_ffffffffffffe990,
                   (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988));
      break;
    case P_FREE:
      local_1005 = 1;
      uVar5 = __cxa_allocate_exception(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_ff0,"XLEAVE04 This should never happen.",&local_ff1);
      SPxInternalCodeException::SPxInternalCodeException
                ((SPxInternalCodeException *)in_stack_ffffffffffffe990,
                 (string *)CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988));
      local_1005 = 0;
      __cxa_throw(uVar5,&SPxInternalCodeException::typeinfo,
                  SPxInternalCodeException::~SPxInternalCodeException);
    }
    pSVar6 = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ::Desc::rowStatus((Desc *)in_stack_ffffffffffffe990,in_stack_ffffffffffffe98c);
    SPxOut::
    debug<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_const_char_(&)[77],_int_&,_soplex::SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Desc::Status_&,_soplex::SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Desc::Status_&,_soplex::StableSum<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_&,_0>
              (in_RDI,(char (*) [77])
                      "DLEAVE55 SPxSolverBase<R>::getLeaveVals2(): row {} : {} -> {} objChange: {}\n"
               ,local_940,&local_94c,pSVar6,in_stack_00000010);
  }
  else {
    SPxColId::SPxColId(&local_1060,&local_908);
    local_1058 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ::number(in_stack_ffffffffffffe990,
                          (SPxColId *)CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988))
    ;
    pSVar6 = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ::Desc::colStatus((Desc *)in_stack_ffffffffffffe990,in_stack_ffffffffffffe98c);
    local_1064 = *pSVar6;
    switch(local_1064) {
    case D_FREE:
      local_808 = infinity();
      local_800 = local_1164;
      local_810 = 0;
      local_378 = local_808;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
                (in_stack_ffffffffffffe9a0,(double)in_stack_ffffffffffffe998,
                 in_stack_ffffffffffffe990);
      local_6a8 = local_928;
      local_6b0 = local_1164;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                ((cpp_dec_float<100U,_int,_void> *)in_stack_ffffffffffffe990,
                 (cpp_dec_float<100U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988));
      puVar7 = (ulong *)infinity();
      local_11c0 = *puVar7 ^ 0x8000000000000000;
      local_7e8 = local_11b4;
      local_7f0 = &local_11c0;
      local_7f8 = 0;
      local_380 = local_7f0;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
                (in_stack_ffffffffffffe9a0,(double)in_stack_ffffffffffffe998,
                 in_stack_ffffffffffffe990);
      local_6b8 = local_930;
      local_6c0 = local_11b4;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                ((cpp_dec_float<100U,_int,_void> *)in_stack_ffffffffffffe990,
                 (cpp_dec_float<100U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988));
      local_4c0 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                *)in_stack_ffffffffffffe990,in_stack_ffffffffffffe98c);
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                ((cpp_dec_float<100U,_int,_void> *)in_stack_ffffffffffffe990,
                 (cpp_dec_float<100U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988));
      pSVar6 = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ::Desc::colStatus((Desc *)in_stack_ffffffffffffe990,in_stack_ffffffffffffe98c);
      *pSVar6 = P_FIXED;
      break;
    case D_ON_UPPER:
      local_1068 = 0;
      local_738 = local_928;
      local_740 = &local_1068;
      local_3c8 = local_740;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                ((cpp_dec_float<100U,_int,_void> *)in_stack_ffffffffffffe990,
                 CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988));
      puVar7 = (ulong *)infinity();
      local_10c0 = *puVar7 ^ 0x8000000000000000;
      local_830 = local_10b8;
      local_838 = &local_10c0;
      local_840 = 0;
      local_368 = local_838;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
                (in_stack_ffffffffffffe9a0,(double)in_stack_ffffffffffffe998,
                 in_stack_ffffffffffffe990);
      local_688 = local_930;
      local_690 = local_10b8;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                ((cpp_dec_float<100U,_int,_void> *)in_stack_ffffffffffffe990,
                 (cpp_dec_float<100U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988));
      pSVar6 = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ::Desc::colStatus((Desc *)in_stack_ffffffffffffe990,in_stack_ffffffffffffe98c);
      *pSVar6 = P_ON_LOWER;
      local_4a0 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                *)in_stack_ffffffffffffe990,in_stack_ffffffffffffe98c);
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                ((cpp_dec_float<100U,_int,_void> *)in_stack_ffffffffffffe990,
                 (cpp_dec_float<100U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988));
      break;
    case D_ON_LOWER:
      local_820 = infinity();
      local_818 = local_1110;
      local_828 = 0;
      local_370 = local_820;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
                (in_stack_ffffffffffffe9a0,(double)in_stack_ffffffffffffe998,
                 in_stack_ffffffffffffe990);
      local_698 = local_928;
      local_6a0 = local_1110;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                ((cpp_dec_float<100U,_int,_void> *)in_stack_ffffffffffffe990,
                 (cpp_dec_float<100U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988));
      local_1114 = 0;
      local_748 = local_930;
      local_750 = &local_1114;
      local_3c0 = local_750;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                ((cpp_dec_float<100U,_int,_void> *)in_stack_ffffffffffffe990,
                 CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988));
      pSVar6 = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ::Desc::colStatus((Desc *)in_stack_ffffffffffffe990,in_stack_ffffffffffffe98c);
      *pSVar6 = P_ON_UPPER;
      local_4b0 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                *)in_stack_ffffffffffffe990,in_stack_ffffffffffffe98c);
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                ((cpp_dec_float<100U,_int,_void> *)in_stack_ffffffffffffe990,
                 (cpp_dec_float<100U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988));
      break;
    case D_ON_BOTH:
      UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::delta(in_RDI->theCoPvec);
      SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::operator[](in_stack_ffffffffffffe998,(int)((ulong)in_stack_ffffffffffffe990 >> 0x20));
      local_248 = local_1210;
      local_258 = &local_1260;
      local_250 = in_RSI;
      boost::multiprecision::detail::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
      ::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                (&local_259,in_RSI,local_258);
      local_240 = local_1210;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<100U,_int,_void> *)in_stack_ffffffffffffe990);
      local_228 = local_1210;
      local_230 = local_250;
      local_238 = local_258;
      boost::multiprecision::default_ops::
      eval_multiply<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                ((cpp_dec_float<100U,_int,_void> *)in_stack_ffffffffffffe990,
                 (cpp_dec_float<100U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988),
                 (cpp_dec_float<100U,_int,_void> *)0x4dcf7a);
      local_1264 = 0;
      tVar2 = boost::multiprecision::operator<
                        ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)in_stack_ffffffffffffe998,(int *)in_stack_ffffffffffffe990);
      if (tVar2) {
        local_1268 = 0;
        local_758 = local_928;
        local_760 = &local_1268;
        local_3b8 = local_760;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                  ((cpp_dec_float<100U,_int,_void> *)in_stack_ffffffffffffe990,
                   CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988));
        puVar7 = (ulong *)infinity();
        local_12c0 = *puVar7 ^ 0x8000000000000000;
        local_7d0 = local_12b8;
        local_7d8 = &local_12c0;
        local_7e0 = 0;
        local_388 = local_7d8;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
                  (in_stack_ffffffffffffe9a0,(double)in_stack_ffffffffffffe998,
                   in_stack_ffffffffffffe990);
        local_6c8 = local_930;
        local_6d0 = local_12b8;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                  ((cpp_dec_float<100U,_int,_void> *)in_stack_ffffffffffffe990,
                   (cpp_dec_float<100U,_int,_void> *)
                   CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988));
        pSVar6 = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ::Desc::colStatus((Desc *)in_stack_ffffffffffffe990,in_stack_ffffffffffffe98c);
        *pSVar6 = P_ON_LOWER;
        local_4d0 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  *)in_stack_ffffffffffffe990,in_stack_ffffffffffffe98c);
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                  ((cpp_dec_float<100U,_int,_void> *)in_stack_ffffffffffffe990,
                   (cpp_dec_float<100U,_int,_void> *)
                   CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988));
      }
      else {
        local_7c0 = infinity();
        local_7b8 = local_1310;
        local_7c8 = 0;
        local_390 = local_7c0;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
                  (in_stack_ffffffffffffe9a0,(double)in_stack_ffffffffffffe998,
                   in_stack_ffffffffffffe990);
        local_6d8 = local_928;
        local_6e0 = local_1310;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                  ((cpp_dec_float<100U,_int,_void> *)in_stack_ffffffffffffe990,
                   (cpp_dec_float<100U,_int,_void> *)
                   CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988));
        local_1314 = 0;
        local_768 = local_930;
        local_770 = &local_1314;
        local_3b0 = local_770;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                  ((cpp_dec_float<100U,_int,_void> *)in_stack_ffffffffffffe990,
                   CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988));
        pSVar6 = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ::Desc::colStatus((Desc *)in_stack_ffffffffffffe990,in_stack_ffffffffffffe98c);
        *pSVar6 = P_ON_UPPER;
        local_4e0 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  *)in_stack_ffffffffffffe990,in_stack_ffffffffffffe98c);
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                  ((cpp_dec_float<100U,_int,_void> *)in_stack_ffffffffffffe990,
                   (cpp_dec_float<100U,_int,_void> *)
                   CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988));
      }
      break;
    case P_FIXED:
      poVar9 = std::operator<<((ostream *)&std::cerr,"ELEAVE56 ");
      poVar9 = std::operator<<(poVar9,"ERROR! Tried to put a fixed column variable into the basis. "
                              );
      poVar9 = std::operator<<(poVar9,"idx=");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,local_1058);
      std::operator<<(poVar9,", lower=");
      SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::lower(in_stack_ffffffffffffe990,in_stack_ffffffffffffe98c);
      poVar9 = boost::multiprecision::operator<<
                         (in_stack_ffffffffffffea20,in_stack_ffffffffffffea18);
      std::operator<<(poVar9,", upper=");
      SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::upper(in_stack_ffffffffffffe990,in_stack_ffffffffffffe98c);
      poVar9 = boost::multiprecision::operator<<
                         (in_stack_ffffffffffffea20,in_stack_ffffffffffffea18);
      std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
      uVar5 = __cxa_allocate_exception(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1528,"XLEAVE07 This should never happen.",&local_1529);
      SPxInternalCodeException::SPxInternalCodeException
                ((SPxInternalCodeException *)in_stack_ffffffffffffe990,
                 (string *)CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988));
      __cxa_throw(uVar5,&SPxInternalCodeException::typeinfo,
                  SPxInternalCodeException::~SPxInternalCodeException);
    default:
      this_00 = (SPxInternalCodeException *)__cxa_allocate_exception(0x28);
      paVar10 = &local_1551;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1550,"XLEAVE08 This should never happen.",paVar10);
      SPxInternalCodeException::SPxInternalCodeException
                (this_00,(string *)CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988));
      __cxa_throw(this_00,&SPxInternalCodeException::typeinfo,
                  SPxInternalCodeException::~SPxInternalCodeException);
    case P_ON_LOWER:
      SVar3 = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::dualColStatus(in_stack_ffffffffffffeab8,in_stack_ffffffffffffeab4);
      pSVar6 = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ::Desc::colStatus((Desc *)in_stack_ffffffffffffe990,in_stack_ffffffffffffe98c);
      *pSVar6 = SVar3;
      SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::upper(in_stack_ffffffffffffe990,in_stack_ffffffffffffe98c);
      local_790 = infinity();
      local_788 = local_1410;
      local_798 = 0;
      local_3a0 = local_790;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
                (in_stack_ffffffffffffe9a0,(double)in_stack_ffffffffffffe998,
                 in_stack_ffffffffffffe990);
      tVar2 = boost::multiprecision::operator<
                        ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988),
                         (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)0x4dd643);
      if (tVar2) {
        pnVar8 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               *)in_stack_ffffffffffffe990,in_stack_ffffffffffffe98c);
        local_538 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  *)in_stack_ffffffffffffe990,in_stack_ffffffffffffe98c);
        local_540 = pnVar8;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                  ((cpp_dec_float<100U,_int,_void> *)in_stack_ffffffffffffe990,
                   (cpp_dec_float<100U,_int,_void> *)
                   CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988));
      }
      local_550 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                *)in_stack_ffffffffffffe990,in_stack_ffffffffffffe98c);
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                ((cpp_dec_float<100U,_int,_void> *)in_stack_ffffffffffffe990,
                 (cpp_dec_float<100U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988));
      local_560 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::upper(in_stack_ffffffffffffe990,in_stack_ffffffffffffe98c);
      local_558 = local_928;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                ((cpp_dec_float<100U,_int,_void> *)in_stack_ffffffffffffe990,
                 (cpp_dec_float<100U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988));
      local_570 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::lower(in_stack_ffffffffffffe990,in_stack_ffffffffffffe98c);
      local_568 = local_930;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                ((cpp_dec_float<100U,_int,_void> *)in_stack_ffffffffffffe990,
                 (cpp_dec_float<100U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988));
      local_580 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::lower(in_stack_ffffffffffffe990,in_stack_ffffffffffffe98c);
      local_578 = local_920;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                ((cpp_dec_float<100U,_int,_void> *)in_stack_ffffffffffffe990,
                 (cpp_dec_float<100U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988));
      local_2c8 = local_1460;
      local_2d0 = in_stack_00000008;
      local_2d8 = local_920;
      boost::multiprecision::detail::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
      ::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                (&local_2d9,in_stack_00000008,local_920);
      local_2c0 = local_1460;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<100U,_int,_void> *)in_stack_ffffffffffffe990);
      local_2a8 = local_1460;
      local_2b0 = local_2d0;
      local_2b8 = local_2d8;
      boost::multiprecision::default_ops::
      eval_multiply<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                ((cpp_dec_float<100U,_int,_void> *)in_stack_ffffffffffffe990,
                 (cpp_dec_float<100U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988),
                 (cpp_dec_float<100U,_int,_void> *)0x4dd873);
      StableSum<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::operator-=((StableSum<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *)in_stack_ffffffffffffe990,
                   (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988));
      break;
    case P_ON_UPPER:
      SVar3 = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::dualColStatus(in_stack_ffffffffffffeab8,in_stack_ffffffffffffeab4);
      pSVar6 = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ::Desc::colStatus((Desc *)in_stack_ffffffffffffe990,in_stack_ffffffffffffe98c);
      *pSVar6 = SVar3;
      SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::lower(in_stack_ffffffffffffe990,in_stack_ffffffffffffe98c);
      puVar7 = (ulong *)infinity();
      local_1370 = *puVar7 ^ 0x8000000000000000;
      local_7a0 = local_1364;
      local_7a8 = &local_1370;
      local_7b0 = 0;
      local_398 = local_7a8;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
                (in_stack_ffffffffffffe9a0,(double)in_stack_ffffffffffffe998,
                 in_stack_ffffffffffffe990);
      tVar2 = boost::multiprecision::operator>
                        ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988),
                         (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)0x4dd33f);
      if (tVar2) {
        pnVar8 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               *)in_stack_ffffffffffffe990,in_stack_ffffffffffffe98c);
        local_4e8 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  *)in_stack_ffffffffffffe990,in_stack_ffffffffffffe98c);
        local_4f0 = pnVar8;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                  ((cpp_dec_float<100U,_int,_void> *)in_stack_ffffffffffffe990,
                   (cpp_dec_float<100U,_int,_void> *)
                   CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988));
      }
      local_500 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                *)in_stack_ffffffffffffe990,in_stack_ffffffffffffe98c);
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                ((cpp_dec_float<100U,_int,_void> *)in_stack_ffffffffffffe990,
                 (cpp_dec_float<100U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988));
      local_510 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::upper(in_stack_ffffffffffffe990,in_stack_ffffffffffffe98c);
      local_508 = local_928;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                ((cpp_dec_float<100U,_int,_void> *)in_stack_ffffffffffffe990,
                 (cpp_dec_float<100U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988));
      local_520 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::lower(in_stack_ffffffffffffe990,in_stack_ffffffffffffe98c);
      local_518 = local_930;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                ((cpp_dec_float<100U,_int,_void> *)in_stack_ffffffffffffe990,
                 (cpp_dec_float<100U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988));
      local_530 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::upper(in_stack_ffffffffffffe990,in_stack_ffffffffffffe98c);
      local_528 = local_920;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                ((cpp_dec_float<100U,_int,_void> *)in_stack_ffffffffffffe990,
                 (cpp_dec_float<100U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988));
      local_288 = local_13c0;
      local_290 = in_stack_00000008;
      local_298 = local_920;
      boost::multiprecision::detail::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
      ::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                (&local_299,in_stack_00000008,local_920);
      local_280 = local_13c0;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<100U,_int,_void> *)in_stack_ffffffffffffe990);
      local_268 = local_13c0;
      local_270 = local_290;
      local_278 = local_298;
      boost::multiprecision::default_ops::
      eval_multiply<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                ((cpp_dec_float<100U,_int,_void> *)in_stack_ffffffffffffe990,
                 (cpp_dec_float<100U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988),
                 (cpp_dec_float<100U,_int,_void> *)0x4dd56f);
      StableSum<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::operator-=((StableSum<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *)in_stack_ffffffffffffe990,
                   (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988));
      break;
    case P_FREE:
      SVar3 = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::dualColStatus(in_stack_ffffffffffffeab8,in_stack_ffffffffffffeab4);
      pSVar6 = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ::Desc::colStatus((Desc *)in_stack_ffffffffffffe990,in_stack_ffffffffffffe98c);
      *pSVar6 = SVar3;
      UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::delta(in_RDI->thePvec);
      SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::operator[](in_stack_ffffffffffffe998,(int)((ulong)in_stack_ffffffffffffe990 >> 0x20));
      local_308 = local_14b0;
      local_310 = &local_1500;
      local_318 = in_RSI;
      boost::multiprecision::detail::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
      ::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                (&local_319,local_310,in_RSI);
      local_300 = local_14b0;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<100U,_int,_void> *)in_stack_ffffffffffffe990);
      local_2e8 = local_14b0;
      local_2f0 = local_310;
      local_2f8 = local_318;
      boost::multiprecision::default_ops::
      eval_multiply<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                ((cpp_dec_float<100U,_int,_void> *)in_stack_ffffffffffffe990,
                 (cpp_dec_float<100U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988),
                 (cpp_dec_float<100U,_int,_void> *)0x4dd9ab);
      local_1504 = 0;
      tVar2 = boost::multiprecision::operator>
                        ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)in_stack_ffffffffffffe998,(int *)in_stack_ffffffffffffe990);
      if (tVar2) {
        local_590 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  *)in_stack_ffffffffffffe990,in_stack_ffffffffffffe98c);
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                  ((cpp_dec_float<100U,_int,_void> *)in_stack_ffffffffffffe990,
                   (cpp_dec_float<100U,_int,_void> *)
                   CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988));
      }
      else {
        local_5a0 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  *)in_stack_ffffffffffffe990,in_stack_ffffffffffffe98c);
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                  ((cpp_dec_float<100U,_int,_void> *)in_stack_ffffffffffffe990,
                   (cpp_dec_float<100U,_int,_void> *)
                   CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988));
      }
      local_5b0 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::upper(in_stack_ffffffffffffe990,in_stack_ffffffffffffe98c);
      local_5a8 = local_928;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                ((cpp_dec_float<100U,_int,_void> *)in_stack_ffffffffffffe990,
                 (cpp_dec_float<100U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988));
      local_5c0 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::lower(in_stack_ffffffffffffe990,in_stack_ffffffffffffe98c);
      local_5b8 = local_930;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                ((cpp_dec_float<100U,_int,_void> *)in_stack_ffffffffffffe990,
                 (cpp_dec_float<100U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988));
      local_1508 = 0;
      local_778 = local_920;
      local_780 = &local_1508;
      local_3a8 = local_780;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                ((cpp_dec_float<100U,_int,_void> *)in_stack_ffffffffffffe990,
                 CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988));
    }
    pSVar6 = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ::Desc::colStatus((Desc *)in_stack_ffffffffffffe990,in_stack_ffffffffffffe98c);
    SPxOut::
    debug<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_const_char_(&)[77],_int_&,_soplex::SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Desc::Status_&,_soplex::SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Desc::Status_&,_soplex::StableSum<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_&,_0>
              (in_RDI,(char (*) [77])
                      "DLEAVE57 SPxSolverBase<R>::getLeaveVals2(): col {} : {} -> {} objChange: {}\n"
               ,&local_1058,&local_1064,pSVar6,in_stack_00000010);
  }
  return;
}

Assistant:

void SPxSolverBase<R>::getLeaveVals2(
   R leaveMax,
   SPxId enterId,
   R& enterBound,
   R& newUBbound,
   R& newLBbound,
   R& newCoPrhs,
   StableSum<R>& objChange
)
{
   typename SPxBasisBase<R>::Desc& ds = this->desc();

   enterBound = 0;

   if(enterId.isSPxRowId())
   {
      int idx = this->number(SPxRowId(enterId));
      typename SPxBasisBase<R>::Desc::Status enterStat = ds.rowStatus(idx);

      // coverity[switch_selector_expr_is_constant]
      switch(enterStat)
      {
      case SPxBasisBase<R>::Desc::D_FREE :
         assert(rep() == ROW);

         if(thePvec->delta()[idx] * leaveMax < 0)
            newCoPrhs = theLRbound[idx];
         else
            newCoPrhs = theURbound[idx];

         newUBbound = R(infinity);
         newLBbound = R(-infinity);
         ds.rowStatus(idx) = SPxBasisBase<R>::Desc::P_FIXED;
         break;

      case SPxBasisBase<R>::Desc::D_ON_UPPER :
         assert(rep() == ROW);
         newUBbound = 0;
         newLBbound = R(-infinity);
         ds.rowStatus(idx) = SPxBasisBase<R>::Desc::P_ON_LOWER;
         newCoPrhs = theLRbound[idx];
         break;

      case SPxBasisBase<R>::Desc::D_ON_LOWER :
         assert(rep() == ROW);
         newUBbound = R(infinity);
         newLBbound = 0;
         ds.rowStatus(idx) = SPxBasisBase<R>::Desc::P_ON_UPPER;
         newCoPrhs = theURbound[idx];
         break;

      case SPxBasisBase<R>::Desc::D_ON_BOTH :
         assert(rep() == ROW);

         if(leaveMax * thePvec->delta()[idx] < 0)
         {
            newUBbound = 0;
            newLBbound = R(-infinity);
            ds.rowStatus(idx) = SPxBasisBase<R>::Desc::P_ON_LOWER;
            newCoPrhs = theLRbound[idx];
         }
         else
         {
            newUBbound = R(infinity);
            newLBbound = 0;
            ds.rowStatus(idx) = SPxBasisBase<R>::Desc::P_ON_UPPER;
            newCoPrhs = theURbound[idx];
         }

         break;

      case SPxBasisBase<R>::Desc::P_ON_UPPER :
         assert(rep() == COLUMN);
         ds.rowStatus(idx) = this->dualRowStatus(idx);

         if(this->lhs(idx) > R(-infinity))
            theURbound[idx] = theLRbound[idx];

         newCoPrhs = theLRbound[idx];        // slack !!
         newUBbound = -this->lhs(idx);
         newLBbound = -this->rhs(idx);
         enterBound = -this->rhs(idx);
         objChange -= newCoPrhs * this->rhs(idx);
         break;

      case SPxBasisBase<R>::Desc::P_ON_LOWER :
         assert(rep() == COLUMN);
         ds.rowStatus(idx) = this->dualRowStatus(idx);

         if(this->rhs(idx) < R(infinity))
            theLRbound[idx] = theURbound[idx];

         newCoPrhs = theURbound[idx];        // slack !!
         newLBbound = -this->rhs(idx);
         newUBbound = -this->lhs(idx);
         enterBound = -this->lhs(idx);
         objChange -= newCoPrhs * this->lhs(idx);
         break;

      case SPxBasisBase<R>::Desc::P_FREE :
         assert(rep() == COLUMN);
#if 1
         throw SPxInternalCodeException("XLEAVE04 This should never happen.");
#else
         SPX_MSG_ERROR(std::cerr << "ELEAVE53 ERROR: not yet debugged!" << std::endl;)
         ds.rowStatus(idx) = this->dualRowStatus(idx);
         newCoPrhs = theURbound[idx];        // slack !!
         newUBbound = R(infinity);
         newLBbound = R(-infinity);
         enterBound = 0;
#endif
         break;

      case SPxBasisBase<R>::Desc::P_FIXED :
         assert(rep() == COLUMN);
         SPX_MSG_ERROR(std::cerr << "ELEAVE54 "
                       << "ERROR! Tried to put a fixed row variable into the basis: "
                       << "idx="   << idx
                       << ", lhs=" << this->lhs(idx)
                       << ", rhs=" << this->rhs(idx) << std::endl;)
         throw SPxInternalCodeException("XLEAVE05 This should never happen.");

      default:
         throw SPxInternalCodeException("XLEAVE06 This should never happen.");
      }

      SPxOut::debug(this, "DLEAVE55 SPxSolverBase<R>::getLeaveVals2(): row {} : {} -> {} objChange: {}\n",
                    idx, enterStat, ds.rowStatus(idx), objChange);
   }

   else
   {
      assert(enterId.isSPxColId());
      int idx = this->number(SPxColId(enterId));
      typename SPxBasisBase<R>::Desc::Status enterStat = ds.colStatus(idx);

      // coverity[switch_selector_expr_is_constant]
      switch(enterStat)
      {
      case SPxBasisBase<R>::Desc::D_ON_UPPER :
         assert(rep() == ROW);
         newUBbound = 0;
         newLBbound = R(-infinity);
         ds.colStatus(idx) = SPxBasisBase<R>::Desc::P_ON_LOWER;
         newCoPrhs = theLCbound[idx];
         break;

      case SPxBasisBase<R>::Desc::D_ON_LOWER :
         assert(rep() == ROW);
         newUBbound = R(infinity);
         newLBbound = 0;
         ds.colStatus(idx) = SPxBasisBase<R>::Desc::P_ON_UPPER;
         newCoPrhs = theUCbound[idx];
         break;

      case SPxBasisBase<R>::Desc::D_FREE :
         assert(rep() == ROW);
         newUBbound = R(infinity);
         newLBbound = R(-infinity);
         newCoPrhs = theLCbound[idx];
         ds.colStatus(idx) = SPxBasisBase<R>::Desc::P_FIXED;
         break;

      case SPxBasisBase<R>::Desc::D_ON_BOTH :
         assert(rep() == ROW);

         if(leaveMax * theCoPvec->delta()[idx] < 0)
         {
            newUBbound = 0;
            newLBbound = R(-infinity);
            ds.colStatus(idx) = SPxBasisBase<R>::Desc::P_ON_LOWER;
            newCoPrhs = theLCbound[idx];
         }
         else
         {
            newUBbound = R(infinity);
            newLBbound = 0;
            ds.colStatus(idx) = SPxBasisBase<R>::Desc::P_ON_UPPER;
            newCoPrhs = theUCbound[idx];
         }

         break;

      case SPxBasisBase<R>::Desc::P_ON_UPPER :
         assert(rep() == COLUMN);
         ds.colStatus(idx) = this->dualColStatus(idx);

         if(SPxLPBase<R>::lower(idx) > R(-infinity))
            theLCbound[idx] = theUCbound[idx];

         newCoPrhs = theUCbound[idx];
         newUBbound = SPxLPBase<R>::upper(idx);
         newLBbound = SPxLPBase<R>::lower(idx);
         enterBound = SPxLPBase<R>::upper(idx);
         objChange -= newCoPrhs * enterBound;
         break;

      case SPxBasisBase<R>::Desc::P_ON_LOWER :
         assert(rep() == COLUMN);
         ds.colStatus(idx) = this->dualColStatus(idx);

         if(SPxLPBase<R>::upper(idx) < R(infinity))
            theUCbound[idx] = theLCbound[idx];

         newCoPrhs = theLCbound[idx];
         newUBbound = SPxLPBase<R>::upper(idx);
         newLBbound = SPxLPBase<R>::lower(idx);
         enterBound = SPxLPBase<R>::lower(idx);
         objChange -= newCoPrhs * enterBound;
         break;

      case SPxBasisBase<R>::Desc::P_FREE :
         assert(rep() == COLUMN);
         ds.colStatus(idx) = this->dualColStatus(idx);

         if(thePvec->delta()[idx] * leaveMax > 0)
            newCoPrhs = theUCbound[idx];
         else
            newCoPrhs = theLCbound[idx];

         newUBbound = SPxLPBase<R>::upper(idx);
         newLBbound = SPxLPBase<R>::lower(idx);
         enterBound = 0;
         break;

      case SPxBasisBase<R>::Desc::P_FIXED :
         assert(rep() == COLUMN);
         SPX_MSG_ERROR(std::cerr << "ELEAVE56 "
                       << "ERROR! Tried to put a fixed column variable into the basis. "
                       << "idx="     << idx
                       << ", lower=" << this->lower(idx)
                       << ", upper=" << this->upper(idx) << std::endl;)
         throw SPxInternalCodeException("XLEAVE07 This should never happen.");

      default:
         throw SPxInternalCodeException("XLEAVE08 This should never happen.");
      }

      SPxOut::debug(this, "DLEAVE57 SPxSolverBase<R>::getLeaveVals2(): col {} : {} -> {} objChange: {}\n",
                    idx, enterStat, ds.colStatus(idx), objChange);
   }

}